

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O0

INT Internal_AddPaddingVfwprintf
              (CPalThread *pthrCurrent,PAL_FILE *stream,LPWSTR In,INT Padding,INT Flags,BOOL convert
              )

{
  int iVar1;
  errno_t eVar2;
  size_t sVar3;
  LPWSTR _Dst;
  int local_58;
  int local_54;
  int iLen;
  INT Written;
  INT Length;
  INT LengthInStr;
  LPWSTR OutOriginal;
  LPWSTR Out;
  BOOL convert_local;
  INT Flags_local;
  INT Padding_local;
  LPWSTR In_local;
  PAL_FILE *stream_local;
  CPalThread *pthrCurrent_local;
  
  local_54 = 0;
  sVar3 = PAL_wcslen(In);
  iVar1 = (int)sVar3;
  iLen = iVar1;
  if (0 < Padding) {
    iLen = Padding + iVar1;
  }
  local_58 = iLen + 1;
  _Dst = (LPWSTR)CorUnix::InternalMalloc((long)local_58 << 1);
  if (_Dst == (LPWSTR)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CorUnix::CPalThread::SetLastError(8);
    pthrCurrent_local._4_4_ = -1;
  }
  else {
    OutOriginal = _Dst;
    if ((Flags & 1U) != 0) {
      eVar2 = wcscpy_s((char16_t_conflict *)_Dst,(long)local_58,(char16_t_conflict *)In);
      if (eVar2 != 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
          CorUnix::InternalFree(_Dst);
          CorUnix::CPalThread::SetLastError(0x7a);
          return -1;
        }
        abort();
      }
      OutOriginal = _Dst + iVar1;
      local_58 = local_58 - iVar1;
    }
    if (0 < Padding) {
      local_58 = local_58 - Padding;
      convert_local = Padding;
      if ((Flags & 4U) == 0) {
        while (convert_local != 0) {
          *OutOriginal = L' ';
          OutOriginal = OutOriginal + 1;
          convert_local = convert_local + -1;
        }
      }
      else {
        while (convert_local != 0) {
          *OutOriginal = L'0';
          OutOriginal = OutOriginal + 1;
          convert_local = convert_local + -1;
        }
      }
    }
    if (((Flags & 1U) == 0) &&
       (eVar2 = wcscpy_s((char16_t_conflict *)OutOriginal,(long)local_58,(char16_t_conflict *)In),
       eVar2 != 0)) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CorUnix::InternalFree(_Dst);
      CorUnix::CPalThread::SetLastError(0x7a);
      pthrCurrent_local._4_4_ = -1;
    }
    else {
      if ((0 < iLen) &&
         ((local_54 = Internal_Convertfwrite
                                (pthrCurrent,_Dst,2,(long)iLen,stream->bsdFilePtr,convert),
          local_54 == -1 && ((PAL_InitializeChakraCoreCalled & 1U) == 0)))) {
        abort();
      }
      CorUnix::InternalFree(_Dst);
      pthrCurrent_local._4_4_ = local_54;
    }
  }
  return pthrCurrent_local._4_4_;
}

Assistant:

static INT Internal_AddPaddingVfwprintf(CPalThread *pthrCurrent, PAL_FILE *stream, LPWSTR In,
                                       INT Padding, INT Flags,BOOL convert)
{
    LPWSTR Out;
    LPWSTR OutOriginal;
    INT LengthInStr;
    INT Length;
    INT Written = 0;

    LengthInStr = PAL_wcslen(In);
    Length = LengthInStr;

    if (Padding > 0)
    {
        Length += Padding;
    }

    int iLen = (Length+1);
    Out = (LPWSTR) InternalMalloc(iLen * sizeof(WCHAR));
    if (!Out)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return -1;
    }
    OutOriginal = Out;

    if (Flags & PFF_MINUS) /* pad on right */
    {
        if (wcscpy_s(Out, iLen, In) != SAFECRT_SUCCESS)
        {
            ERROR("wcscpy_s failed!\n");
            InternalFree(OutOriginal);
            pthrCurrent->SetLastError(ERROR_INSUFFICIENT_BUFFER);
            return -1;
        }
        Out += LengthInStr;
        iLen -= LengthInStr;
    }
    if (Padding > 0)
    {
        iLen -= Padding;
        if (Flags & PFF_ZERO) /* '0', pad with zeros */
        {
            while (Padding--)
            {
                *Out++ = '0';
            }
        }
        else /* pad with spaces */
        {
            while (Padding--)
            {
                *Out++ = ' ';
            }
        }
    }
    if (!(Flags & PFF_MINUS)) /* put 'In' after padding */
    {
        if (wcscpy_s(Out, iLen, In) != SAFECRT_SUCCESS)
        {
            ERROR("wcscpy_s failed!\n");
            InternalFree(OutOriginal);
            pthrCurrent->SetLastError(ERROR_INSUFFICIENT_BUFFER);
            return -1;
        }

        Out += LengthInStr;
        iLen -= LengthInStr;
    }

    if (Length > 0) {
        Written = Internal_Convertfwrite(pthrCurrent, OutOriginal, sizeof(char16_t), Length,
            (FILE*)(stream->bsdFilePtr), convert);

        if (-1 == Written)
        {
            ERROR("fwrite() failed with errno == %d\n", errno);
        }
    }
    InternalFree(OutOriginal);

    return Written;
}